

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_delete.hpp
# Opt level: O0

void boost::checked_delete<boost::runtime::cla::rt_cla_detail::parameter_trie>(parameter_trie *x)

{
  parameter_trie *in_RDI;
  
  if (in_RDI != (parameter_trie *)0x0) {
    runtime::cla::rt_cla_detail::parameter_trie::~parameter_trie(in_RDI);
    operator_delete(in_RDI,0x60);
  }
  return;
}

Assistant:

inline void checked_delete(T * x)
{
    // intentionally complex - simplification causes regressions
    typedef char type_must_be_complete[ sizeof(T)? 1: -1 ];
    (void) sizeof(type_must_be_complete);
    delete x;
}